

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O0

void Create_Pop_Up_Dialog(void)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  ushort uVar3;
  Am_Wrapper *pAVar4;
  Am_Method_Wrapper *pAVar5;
  undefined8 uVar6;
  Am_Value_List *pAVar7;
  Am_Object *pAVar8;
  Am_Object *pAVar9;
  Am_Object *pAVar10;
  Am_Object local_70;
  Am_Object local_68;
  Am_Value_List local_60 [16];
  Am_Object local_50;
  Am_Object local_48;
  Am_Value_List local_40 [16];
  Am_Object local_30;
  Am_Object local_28 [3];
  Am_Object local_10;
  
  Am_Object::Create((char *)&local_10);
  uVar2 = Am_Object::Set((ushort)&local_10,true,0);
  uVar2 = Am_Object::Set(uVar2,100,100);
  uVar2 = Am_Object::Set(uVar2,0x65,100);
  uVar2 = Am_Object::Set(uVar2,0x66,0x113);
  uVar2 = Am_Object::Set(uVar2,0x67,100);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Blue);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  pAVar5 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_
                     ((Am_Object_Method *)&Am_Default_Pop_Up_Window_Destroy_Method);
  uVar2 = Am_Object::Set(uVar2,(Am_Method_Wrapper *)0x89,(ulong)pAVar5);
  AVar1 = MY_WIDGET;
  Am_Object::Create((char *)&local_30);
  uVar3 = Am_Object::Set((ushort)&local_30,100,0x14);
  uVar3 = Am_Object::Set(uVar3,0x65,0x14);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Blue);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Value_List::Am_Value_List(local_40);
  uVar6 = Am_Value_List::Add(local_40,"Hamburger",1);
  uVar6 = Am_Value_List::Add(uVar6,"Hot dog",1);
  pAVar7 = (Am_Value_List *)Am_Value_List::Add(uVar6,"Chicken Nuggets",1);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0xa2,(ulong)pAVar4);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar3,(char *)0x169,0x10703e);
  Am_Object::Am_Object(local_28,pAVar8);
  pAVar8 = (Am_Object *)Am_Object::Add_Part(uVar2,(Am_Object *)(ulong)AVar1,(ulong)local_28);
  Am_Object::Create((char *)&local_50);
  uVar2 = Am_Object::Set((ushort)&local_50,100,0xaf);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Blue);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Value_List::Am_Value_List(local_60);
  Am_Object::Create((char *)&local_68);
  uVar3 = Am_Object::Set((ushort)&local_68,(char *)0x150,0x10706d);
  pAVar5 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&ok_method);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar3,(Am_Method_Wrapper *)0xca,(ulong)pAVar5);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar9);
  uVar6 = Am_Value_List::Add(local_60,pAVar4,1);
  Am_Object::Create((char *)&local_70);
  uVar3 = Am_Object::Set((ushort)&local_70,(char *)0x150,0x107070);
  pAVar5 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&cancel_method);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar3,(Am_Method_Wrapper *)0xca,(ulong)pAVar5);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar9);
  pAVar7 = (Am_Value_List *)Am_Value_List::Add(uVar6,pAVar4,1);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xa2,(ulong)pAVar4);
  Am_Object::Am_Object(&local_48,pAVar10);
  pAVar8 = (Am_Object *)Am_Object::Add_Part(pAVar8,SUB81(&local_48,0),1);
  Am_Object::operator=(&pop_up_window,pAVar8);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  Am_Value_List::~Am_Value_List(local_60);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(local_28);
  Am_Value_List::~Am_Value_List(local_40);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_10);
  return;
}

Assistant:

void Create_Pop_Up_Dialog() {
  pop_up_window = Am_Window.Create("pop up window")
    .Set (Am_VISIBLE, false) //start off window as invisible
    .Set (Am_LEFT, 100)
    .Set (Am_TOP, 100)
    .Set (Am_WIDTH, 275)
    .Set (Am_HEIGHT, 100)
    .Set (Am_FILL_STYLE, Am_Motif_Light_Blue)
    // the Am_DESTROY_WINDOW_METHOD is called if the user closes the
    // window using the close box.  The default method Destroys the
    // window, which we don't want to do.  Instead, use popup window handler,
    // which does Cancel.
    .Set (Am_DESTROY_WINDOW_METHOD, Am_Default_Pop_Up_Window_Destroy_Method)
    .Add_Part(MY_WIDGET, Am_Radio_Button_Panel.Create()
	      .Set(Am_LEFT, 20)
	      .Set(Am_TOP, 20)
	      .Set (Am_FILL_STYLE, Am_Motif_Light_Blue)
	      .Set (Am_ITEMS, Am_Value_List()
		    .Add("Hamburger")
		    .Add("Hot dog")
		    .Add("Chicken Nuggets")
		    )
	      .Set(Am_VALUE, "Hamburger") //initial value for widget
	      )
    .Add_Part(Am_Button_Panel.Create("ok-cancel")
	      //use a built-in formula for left that will make be
	      //centered in window
	      .Set(Am_LEFT, 175)
	      .Set(Am_TOP, 10)
	      .Set(Am_FILL_STYLE, Am_Motif_Light_Blue)
	      .Set(Am_ITEMS, Am_Value_List()
		   //the default Am_Standard_OK_Command just returns
		   //true, but our custom ok_method will return the
		   //correct value.
		   .Add(Am_Command.Create("ok")
			.Set(Am_LABEL, "OK")
			.Set(Am_DO_METHOD, ok_method))
		   .Add(Am_Command.Create("cancel")
			.Set(Am_LABEL, "CANCEL")
			.Set(Am_DO_METHOD, cancel_method))
		   )
	      )
    ;
}